

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall CVmObjBigNum::neg_val(CVmObjBigNum *this,vm_val_t *result,vm_obj_id_t self)

{
  void *__src;
  int iVar1;
  vm_obj_id_t obj;
  vm_val_t *this_00;
  char *ext;
  size_t __n;
  vm_obj_id_t in_EDX;
  vm_val_t *in_RSI;
  long in_RDI;
  size_t prec;
  char *new_ext;
  undefined8 in_stack_ffffffffffffffb0;
  int in_root_set;
  char *__dest;
  size_t local_30;
  
  in_root_set = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_30 = get_prec((char *)0x2badc5);
  iVar1 = get_type(*(char **)(in_RDI + 8));
  if (((iVar1 == 0) || (iVar1 = get_type(*(char **)(in_RDI + 8)), iVar1 == 4)) &&
     (iVar1 = is_zero(*(char **)(in_RDI + 8)), iVar1 == 0)) {
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_EDX);
    iVar1 = is_infinity((char *)0x2bae40);
    if (iVar1 != 0) {
      local_30 = 1;
    }
    obj = create(in_root_set,(size_t)in_RSI);
    vm_val_t::set_obj(in_RSI,obj);
    ext = get_objid_ext(0);
    __src = *(void **)(in_RDI + 8);
    __dest = ext;
    __n = calc_alloc(local_30);
    memcpy(__dest,__src,__n);
    iVar1 = get_neg(ext);
    set_neg(ext,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    CVmStack::discard();
    return 1;
  }
  vm_val_t::set_obj(in_RSI,in_EDX);
  return 1;
}

Assistant:

int CVmObjBigNum::neg_val(VMG_ vm_val_t *result, vm_obj_id_t self)
{
    char *new_ext;
    size_t prec = get_prec(ext_);

    /* 
     *   If I'm not an ordinary number or an infinity, return myself
     *   unchanged.  Note that we change sign for an infinity, even though
     *   this might not make a great deal of sense mathematically.
     *   
     *   If I'm zero, likewise return myself unchanged.  Negative zero is
     *   still zero.  
     */
    if ((get_type(ext_) != VMBN_T_NUM && get_type(ext_) != VMBN_T_INF)
        || is_zero(ext_))
    {
        /* return myself unchanged */
        result->set_obj(self);
        return TRUE;
    }

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* if I'm an infinity, we don't need any precision in the result */
    if (is_infinity(ext_))
        prec = 1;

    /* create a new number with the same precision as the original */
    result->set_obj(create(vmg_ FALSE, prec));
    new_ext = get_objid_ext(vmg_ result->val.obj);

    /* make a copy in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* reverse the sign */
    set_neg(new_ext, !get_neg(new_ext));

    /* remove my self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}